

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::repairencfacs(tetgenmesh *this,int chkencflag)

{
  uint uVar1;
  shellface *pppdVar2;
  long lVar3;
  int iVar4;
  face *chkfac;
  long *plVar5;
  point encpt1;
  memorypool *pmVar6;
  int qflag;
  point encpt;
  double ccent [3];
  int local_54;
  point local_50;
  double local_48 [3];
  
  local_50 = (point)0x0;
  local_54 = 0;
LAB_0013bcd0:
  pmVar6 = this->badsubfacs;
  if (0 < pmVar6->items) {
    if (this->steinerleft != 0) {
      memorypool::traversalinit(pmVar6);
      while( true ) {
        chkfac = (face *)memorypool::traverse(this->badsubfacs);
        if ((chkfac == (face *)0x0) || (this->steinerleft == 0)) break;
        if (-1 < chkfac->shver) {
          pppdVar2 = chkfac->sh;
          if ((pppdVar2 != (shellface *)0x0) && (pppdVar2[3] != (shellface)0x0)) {
            uVar1 = *(uint *)((long)pppdVar2 + (long)this->shmarkindex * 4 + 4);
            if ((uVar1 & 4) != 0) {
              *(uint *)((long)pppdVar2 + (long)this->shmarkindex * 4 + 4) = uVar1 & 0xfffffffb;
              encpt1 = (point)&local_54;
              iVar4 = checkfac4split(this,chkfac,&local_50,&local_54,local_48);
              if (iVar4 != 0) {
                splitsubface(this,chkfac,local_50,encpt1,local_54,local_48,chkencflag);
              }
            }
          }
          chkfac->shver = -1;
          pmVar6 = this->badsubfacs;
          chkfac->sh = (shellface *)pmVar6->deaditemstack;
          pmVar6->deaditemstack = chkfac;
          pmVar6->items = pmVar6->items + -1;
        }
      }
      goto LAB_0013bcd0;
    }
    if (this->b->verbose != 0) {
      puts("The desired number of Steiner points is reached.");
      pmVar6 = this->badsubfacs;
    }
    memorypool::traversalinit(pmVar6);
    while( true ) {
      plVar5 = (long *)memorypool::traverse(this->badsubfacs);
      if (plVar5 == (long *)0x0) break;
      if (((-1 < (int)plVar5[1]) && (lVar3 = *plVar5, lVar3 != 0)) && (*(long *)(lVar3 + 0x18) != 0)
         ) {
        uVar1 = *(uint *)(lVar3 + 4 + (long)this->shmarkindex * 4);
        if ((uVar1 & 4) != 0) {
          *(uint *)(lVar3 + 4 + (long)this->shmarkindex * 4) = uVar1 & 0xfffffffb;
        }
      }
    }
    memorypool::restart(this->badsubfacs);
  }
  return;
}

Assistant:

void tetgenmesh::repairencfacs(int chkencflag)
{
  face *bface;
  point encpt = NULL;
  int qflag = 0;
  REAL ccent[3];

  // Loop until the pool 'badsubfacs' is empty. Note that steinerleft == -1
  //   if an unlimited number of Steiner points is allowed.
  while ((badsubfacs->items > 0) && (steinerleft != 0)) {
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while ((bface != NULL) && (steinerleft != 0)) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        // A queued subface may have been deleted (split).
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          // A queued subface may have been processed. 
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
            if (checkfac4split(bface, encpt, qflag, ccent)) {
              splitsubface(bface, encpt, NULL, qflag, ccent, chkencflag);
            }
          }
        }
        bface->shver = -1; // Signal it as a deleted element.
        badsubfacs->dealloc((void *) bface); // Remove this entry from list.
      }
      bface = (face *) badsubfacs->traverse();
    }
  }

  if (badsubfacs->items > 0) {
    if (steinerleft == 0) {
      if (b->verbose) {
        printf("The desired number of Steiner points is reached.\n");
      }
    } else {
      terminatetetgen(this, 2);
    }
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while (bface  != NULL) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
          }
        }
      }
      bface = (face *) badsubfacs->traverse();
    }
    badsubfacs->restart();
  }
}